

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O1

LY_ERR lys_compile_type_union
                 (lysc_ctx *ctx,lysp_type *ptypes,lysp_node *context_pnode,uint16_t context_flags,
                 char *context_name,lysc_type ***utypes_p)

{
  int *piVar1;
  lysc_type **type;
  char *pcVar2;
  bool bVar3;
  LY_ERR LVar4;
  int iVar5;
  long *plVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  lysc_type *type_00;
  ulong uVar10;
  lysc_type **pplVar11;
  ulong uVar12;
  long local_70;
  
  pplVar11 = *utypes_p;
  if (pplVar11 == (lysc_type **)0x0) {
    plVar6 = (long *)calloc(1,*(long *)&ptypes[-1].fraction_digits * 8 + 8);
    if (plVar6 != (long *)0x0) goto LAB_0014d7ff;
    pplVar11 = (lysc_type **)0x0;
    LVar4 = LY_EMEM;
    ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_union");
    bVar3 = false;
  }
  else {
    plVar6 = (long *)realloc(pplVar11 + -1,
                             ((long)&pplVar11[-1]->name + *(long *)&ptypes[-1].fraction_digits) * 8
                             + 8);
    if (plVar6 == (long *)0x0) {
      bVar3 = false;
      LVar4 = LY_EMEM;
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_union");
    }
    else {
LAB_0014d7ff:
      pplVar11 = (lysc_type **)(plVar6 + 1);
      lVar9._0_1_ = ptypes[-1].fraction_digits;
      lVar9._1_1_ = ptypes[-1].require_instance;
      lVar9._2_2_ = ptypes[-1].flags;
      lVar9._4_4_ = *(undefined4 *)&ptypes[-1].field_0x64;
      LVar4 = LY_SUCCESS;
      memset(plVar6 + *plVar6 + 1,0,lVar9 << 3);
      bVar3 = true;
    }
  }
  if (bVar3) {
    iVar5 = 3;
    type_00 = (lysc_type *)0x0;
    lVar7._0_1_ = ptypes[-1].fraction_digits;
    lVar7._1_1_ = ptypes[-1].require_instance;
    lVar7._2_2_ = ptypes[-1].flags;
    lVar7._4_4_ = *(undefined4 *)&ptypes[-1].field_0x64;
    if (lVar7 != 0) {
      lVar9 = 0;
      local_70 = 0;
      uVar12 = 0;
      do {
        type = pplVar11 + local_70 + uVar12;
        LVar4 = lys_compile_type(ctx,context_pnode,context_flags,context_name,ptypes + uVar12,type,
                                 (char **)0x0,(lysp_qname **)0x0);
        if (LVar4 != LY_SUCCESS) {
          iVar5 = 2;
          type_00 = (lysc_type *)0x0;
          goto LAB_0014dad1;
        }
        LOCK();
        (*type)->refcount = (*type)->refcount + 1;
        UNLOCK();
        type_00 = *type;
        if (type_00->basetype == LY_TYPE_UNION) {
          if (pplVar11 == (lysc_type **)0x0) {
            if (type_00[1].name == (char *)0x0) {
              lVar7 = 0;
            }
            else {
              lVar7 = *(long *)(type_00[1].name + -8);
            }
            plVar6 = (long *)calloc(1,(*(long *)&ptypes[-1].fraction_digits + local_70 + lVar7) * 8
                                      + 8);
            if (plVar6 != (long *)0x0) goto LAB_0014d977;
            pplVar11 = (lysc_type **)0x0;
            LVar4 = LY_EMEM;
            ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lys_compile_type_union");
            iVar5 = 2;
            bVar3 = false;
          }
          else {
            if (type_00[1].name == (char *)0x0) {
              lVar7 = 0;
            }
            else {
              lVar7 = *(long *)(type_00[1].name + -8);
            }
            plVar6 = (long *)realloc(pplVar11 + -1,
                                     (*(long *)&ptypes[-1].fraction_digits + local_70 + lVar7) * 8 +
                                     8);
            if (plVar6 == (long *)0x0) {
              bVar3 = false;
              LVar4 = LY_EMEM;
              ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lys_compile_type_union");
              iVar5 = 2;
            }
            else {
LAB_0014d977:
              if (type_00[1].name == (char *)0x0) {
                lVar7 = 0;
              }
              else {
                lVar7 = *(long *)(type_00[1].name + -8);
              }
              pplVar11 = (lysc_type **)(plVar6 + 1);
              LVar4 = LY_SUCCESS;
              memset(plVar6 + *plVar6 + 1,0,
                     (lVar7 + *(long *)&ptypes[-1].fraction_digits + (local_70 - *plVar6)) * 8);
              bVar3 = true;
              iVar5 = 0;
            }
          }
          if (!bVar3) goto LAB_0014dad1;
          uVar8 = 0;
          while( true ) {
            pcVar2 = type_00[1].name;
            if (pcVar2 == (char *)0x0) {
              uVar10 = 0;
            }
            else {
              uVar10 = *(ulong *)(pcVar2 + -8);
            }
            if (uVar10 <= uVar8) break;
            *(undefined8 *)((long)pplVar11 + uVar8 * 8 + lVar9 + local_70 * 8) =
                 *(undefined8 *)(pcVar2 + uVar8 * 8);
            LOCK();
            piVar1 = (int *)(*(long *)(type_00[1].name + uVar8 * 8) + 0x1c);
            *piVar1 = *piVar1 + 1;
            UNLOCK();
            pplVar11[-1] = (lysc_type *)((long)&pplVar11[-1]->name + 1);
            uVar8 = uVar8 + 1;
          }
          local_70 = local_70 + uVar8 + -1;
          lysc_type_free(&ctx->free_ctx,type_00);
        }
        else {
          pplVar11[-1] = (lysc_type *)((long)&pplVar11[-1]->name + 1);
          LVar4 = LY_SUCCESS;
        }
        uVar12 = uVar12 + 1;
        lVar9 = lVar9 + 8;
        uVar8._0_1_ = ptypes[-1].fraction_digits;
        uVar8._1_1_ = ptypes[-1].require_instance;
        uVar8._2_2_ = ptypes[-1].flags;
        uVar8._4_4_ = *(undefined4 *)&ptypes[-1].field_0x64;
      } while (uVar12 < uVar8);
      type_00 = (lysc_type *)0x0;
      iVar5 = 3;
    }
LAB_0014dad1:
    if (iVar5 == 3) {
      LVar4 = LY_SUCCESS;
      goto LAB_0014daf9;
    }
    if (iVar5 != 2) {
      return LVar4;
    }
  }
  else {
    type_00 = (lysc_type *)0x0;
  }
  if (type_00 != (lysc_type *)0x0) {
    lysc_type_free(&ctx->free_ctx,type_00);
  }
LAB_0014daf9:
  *utypes_p = pplVar11;
  return LVar4;
}

Assistant:

static LY_ERR
lys_compile_type_union(struct lysc_ctx *ctx, struct lysp_type *ptypes, struct lysp_node *context_pnode, uint16_t context_flags,
        const char *context_name, struct lysc_type ***utypes_p)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_type **utypes = *utypes_p;
    struct lysc_type_union *un_aux = NULL;

    LY_ARRAY_CREATE_GOTO(ctx->ctx, utypes, LY_ARRAY_COUNT(ptypes), ret, error);
    for (LY_ARRAY_COUNT_TYPE u = 0, additional = 0; u < LY_ARRAY_COUNT(ptypes); ++u) {
        ret = lys_compile_type(ctx, context_pnode, context_flags, context_name, &ptypes[u], &utypes[u + additional],
                NULL, NULL);
        LY_CHECK_GOTO(ret, error);
        LY_ATOMIC_INC_BARRIER(utypes[u + additional]->refcount);

        if (utypes[u + additional]->basetype == LY_TYPE_UNION) {
            /* add space for additional types from the union subtype */
            un_aux = (struct lysc_type_union *)utypes[u + additional];
            LY_ARRAY_CREATE_GOTO(ctx->ctx, utypes,
                    LY_ARRAY_COUNT(ptypes) + additional + LY_ARRAY_COUNT(un_aux->types) - LY_ARRAY_COUNT(utypes), ret, error);

            /* copy subtypes of the subtype union */
            for (LY_ARRAY_COUNT_TYPE v = 0; v < LY_ARRAY_COUNT(un_aux->types); ++v) {
                utypes[u + additional] = un_aux->types[v];
                LY_ATOMIC_INC_BARRIER(un_aux->types[v]->refcount);
                ++additional;
                LY_ARRAY_INCREMENT(utypes);
            }
            /* compensate u increment in main loop */
            --additional;

            /* free the replaced union subtype */
            lysc_type_free(&ctx->free_ctx, (struct lysc_type *)un_aux);
            un_aux = NULL;
        } else {
            LY_ARRAY_INCREMENT(utypes);
        }
    }

    *utypes_p = utypes;
    return LY_SUCCESS;

error:
    if (un_aux) {
        lysc_type_free(&ctx->free_ctx, (struct lysc_type *)un_aux);
    }
    *utypes_p = utypes;
    return ret;
}